

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

void __thiscall Lexer::Lexer(Lexer *this,char *input)

{
  size_t sVar1;
  
  (this->input_).str_ = (char *)0x0;
  (this->input_).len_ = 0;
  (this->filename_).str_ = (char *)0x0;
  (this->filename_).len_ = 0;
  sVar1 = strlen(input);
  (this->filename_).str_ = "input";
  (this->filename_).len_ = 5;
  (this->input_).str_ = input;
  (this->input_).len_ = sVar1;
  this->ofs_ = input;
  this->last_token_ = (char *)0x0;
  return;
}

Assistant:

Lexer::Lexer(const char* input) {
  Start("input", input);
}